

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O3

CURLcode imap_calc_sasl_details
                   (connectdata *conn,char **mech,char **initresp,size_t *len,imapstate *state1,
                   imapstate *state2)

{
  uint uVar1;
  int iVar2;
  SessionHandle *data;
  CURLcode CVar3;
  
  data = conn->data;
  uVar1 = (conn->proto).imapc.authmechs;
  if (((uVar1 & 8) == 0) || ((*(byte *)((long)&conn->proto + 0x80) & 8) == 0)) {
    if (((uVar1 & 4) == 0) || ((*(byte *)((long)&conn->proto + 0x80) & 4) == 0)) {
      if ((((char)uVar1 < '\0') &&
          (iVar2 = (conn->proto).ftpc.dirdepth, iVar2 != -1 && (char)iVar2 < '\0')) ||
         (conn->xoauth2_bearer != (char *)0x0)) {
        *mech = "XOAUTH2";
        *state1 = IMAP_AUTHENTICATE_XOAUTH2;
        *state2 = IMAP_AUTHENTICATE_FINAL;
        (conn->proto).ftpc.diralloc = 0x80;
        if (((conn->proto).ftpc.cwdfail != false) || ((data->set).sasl_ir == true)) {
          CVar3 = Curl_sasl_create_xoauth2_message
                            (data,conn->user,conn->xoauth2_bearer,initresp,len);
          return CVar3;
        }
      }
      else if (((uVar1 & 1) == 0) || ((*(byte *)((long)&conn->proto + 0x80) & 1) == 0)) {
        if (((uVar1 & 2) != 0) && ((*(byte *)((long)&conn->proto + 0x80) & 2) != 0)) {
          *mech = "PLAIN";
          *state1 = IMAP_AUTHENTICATE_PLAIN;
          *state2 = IMAP_AUTHENTICATE_FINAL;
          (conn->proto).ftpc.diralloc = 2;
          if (((conn->proto).ftpc.cwdfail != false) || ((data->set).sasl_ir == true)) {
            CVar3 = Curl_sasl_create_plain_message(data,conn->user,conn->passwd,initresp,len);
            return CVar3;
          }
        }
      }
      else {
        *mech = "LOGIN";
        *state1 = IMAP_AUTHENTICATE_LOGIN;
        *state2 = IMAP_AUTHENTICATE_LOGIN_PASSWD;
        (conn->proto).ftpc.diralloc = 1;
        if (((conn->proto).ftpc.cwdfail != false) || ((data->set).sasl_ir == true)) {
          CVar3 = Curl_sasl_create_login_message(data,conn->user,initresp,len);
          return CVar3;
        }
      }
    }
    else {
      *mech = "CRAM-MD5";
      *state1 = IMAP_AUTHENTICATE_CRAMMD5;
      (conn->proto).ftpc.diralloc = 4;
    }
  }
  else {
    *mech = "DIGEST-MD5";
    *state1 = IMAP_AUTHENTICATE_DIGESTMD5;
    (conn->proto).ftpc.diralloc = 8;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode imap_calc_sasl_details(struct connectdata *conn,
                                       const char **mech,
                                       char **initresp, size_t *len,
                                       imapstate *state1, imapstate *state2)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;
  struct imap_conn *imapc = &conn->proto.imapc;

  /* Calculate the supported authentication mechanism, by decreasing order of
     security, as well as the initial response where appropriate */
#if defined(USE_WINDOWS_SSPI)
    if((imapc->authmechs & SASL_MECH_GSSAPI) &&
       (imapc->prefmech & SASL_MECH_GSSAPI)) {
    imapc->mutual_auth = FALSE; /* TODO: Calculate mutual authentication */

    *mech = SASL_MECH_STRING_GSSAPI;
    *state1 = IMAP_AUTHENTICATE_GSSAPI;
    *state2 = IMAP_AUTHENTICATE_GSSAPI_TOKEN;
    imapc->authused = SASL_MECH_GSSAPI;

    if(imapc->ir_supported || data->set.sasl_ir)
      result = Curl_sasl_create_gssapi_user_message(data, conn->user,
                                                    conn->passwd, "imap",
                                                    imapc->mutual_auth,
                                                    NULL, &conn->krb5,
                                                    initresp, len);
  }
  else
#endif
#ifndef CURL_DISABLE_CRYPTO_AUTH
  if((imapc->authmechs & SASL_MECH_DIGEST_MD5) &&
     (imapc->prefmech & SASL_MECH_DIGEST_MD5)) {
    *mech = SASL_MECH_STRING_DIGEST_MD5;
    *state1 = IMAP_AUTHENTICATE_DIGESTMD5;
    imapc->authused = SASL_MECH_DIGEST_MD5;
  }
  else if((imapc->authmechs & SASL_MECH_CRAM_MD5) &&
          (imapc->prefmech & SASL_MECH_CRAM_MD5)) {
    *mech = SASL_MECH_STRING_CRAM_MD5;
    *state1 = IMAP_AUTHENTICATE_CRAMMD5;
    imapc->authused = SASL_MECH_CRAM_MD5;
  }
  else
#endif
#ifdef USE_NTLM
    if((imapc->authmechs & SASL_MECH_NTLM) &&
       (imapc->prefmech & SASL_MECH_NTLM)) {
    *mech = SASL_MECH_STRING_NTLM;
    *state1 = IMAP_AUTHENTICATE_NTLM;
    *state2 = IMAP_AUTHENTICATE_NTLM_TYPE2MSG;
    imapc->authused = SASL_MECH_NTLM;

    if(imapc->ir_supported || data->set.sasl_ir)
      result = Curl_sasl_create_ntlm_type1_message(conn->user, conn->passwd,
                                                   &conn->ntlm,
                                                   initresp, len);
  }
  else
#endif
  if(((imapc->authmechs & SASL_MECH_XOAUTH2) &&
      (imapc->prefmech & SASL_MECH_XOAUTH2) &&
      (imapc->prefmech != SASL_AUTH_ANY)) || conn->xoauth2_bearer) {
    *mech = SASL_MECH_STRING_XOAUTH2;
    *state1 = IMAP_AUTHENTICATE_XOAUTH2;
    *state2 = IMAP_AUTHENTICATE_FINAL;
    imapc->authused = SASL_MECH_XOAUTH2;

    if(imapc->ir_supported || data->set.sasl_ir)
      result = Curl_sasl_create_xoauth2_message(data, conn->user,
                                                conn->xoauth2_bearer,
                                                initresp, len);
  }
  else if((imapc->authmechs & SASL_MECH_LOGIN) &&
          (imapc->prefmech & SASL_MECH_LOGIN)) {
    *mech = SASL_MECH_STRING_LOGIN;
    *state1 = IMAP_AUTHENTICATE_LOGIN;
    *state2 = IMAP_AUTHENTICATE_LOGIN_PASSWD;
    imapc->authused = SASL_MECH_LOGIN;

    if(imapc->ir_supported || data->set.sasl_ir)
      result = Curl_sasl_create_login_message(data, conn->user, initresp, len);
  }
  else if((imapc->authmechs & SASL_MECH_PLAIN) &&
          (imapc->prefmech & SASL_MECH_PLAIN)) {
    *mech = SASL_MECH_STRING_PLAIN;
    *state1 = IMAP_AUTHENTICATE_PLAIN;
    *state2 = IMAP_AUTHENTICATE_FINAL;
    imapc->authused = SASL_MECH_PLAIN;

    if(imapc->ir_supported || data->set.sasl_ir)
      result = Curl_sasl_create_plain_message(data, conn->user, conn->passwd,
                                              initresp, len);
  }

  return result;
}